

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

string * get_graph_by_value_abi_cxx11_(uint value,uint max,uint len)

{
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  string *in_RDI;
  uint bar_count;
  uint step;
  string *bars;
  undefined4 local_18;
  
  local_18 = 0;
  std::__cxx11::string::string(in_RDI);
  for (; local_18 < (uint)(long)((float)((double)in_ESI / ((double)in_EDX + -0.1)) * (float)in_ECX);
      local_18 = local_18 + 1) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  for (; local_18 < in_ECX; local_18 = local_18 + 1) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string get_graph_by_value( unsigned value, unsigned max, unsigned len )
{
  unsigned step = 0;
  std::string bars;

  unsigned bar_count = ( static_cast<float>( value / ( max - 0.1 ) ) * len );

  for( ; step < bar_count; step++ )
  {
    bars.append( "|" );
  }
  for( ; step < len; step++ )
  {
    bars.append( " " );
  }

  return bars;
}